

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::OBJMaterial> *material,ssize_t id)

{
  int __oflag;
  allocator local_109;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_c8;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"material",&local_109);
  std::__cxx11::string::string
            (local_58,(string *)&(material->ptr->super_MaterialNode).super_Node.name);
  open(this,(char *)local_38,(int)id,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  store(this,"code","OBJ");
  std::__cxx11::string::string(local_78,"parameters",&local_109);
  open(this,(char *)local_78,__oflag);
  std::__cxx11::string::~string(local_78);
  store_parm(this,"d",&material->ptr->d);
  store_parm(this,"Ka",&material->ptr->Ka);
  store_parm(this,"Kd",&material->ptr->Kd);
  store_parm(this,"Ks",&material->ptr->Ks);
  store_parm(this,"Kt",&material->ptr->Kt);
  store_parm(this,"Ns",&material->ptr->Ns);
  store_parm(this,"Ni",&material->ptr->Ni);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             &(material->ptr->_map_d).
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  store_parm(this,"map_d",(shared_ptr<embree::Texture> *)&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,
             &(material->ptr->_map_Kd).
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  store_parm(this,"map_Kd",(shared_ptr<embree::Texture> *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,
             &(material->ptr->_map_Ks).
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  store_parm(this,"map_Ks",(shared_ptr<embree::Texture> *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f8,
             &(material->ptr->_map_Ns).
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  store_parm(this,"map_Ns",(shared_ptr<embree::Texture> *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,
             &(material->ptr->_map_Displ).
              super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  store_parm(this,"map_Displ",(shared_ptr<embree::Texture> *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  std::__cxx11::string::string(local_98,"parameters",&local_109);
  close(this,(int)local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::string(local_b8,"material",&local_109);
  close(this,(int)local_b8);
  std::__cxx11::string::~string(local_b8);
  return;
}

Assistant:

void XMLWriter::store(Ref<OBJMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","OBJ");
    open("parameters");
    store_parm("d",material->d);
    store_parm("Ka",material->Ka);
    store_parm("Kd",material->Kd);
    store_parm("Ks",material->Ks);
    store_parm("Kt",material->Kt);
    store_parm("Ns",material->Ns);
    store_parm("Ni",material->Ni);
    store_parm("map_d",material->_map_d);
    store_parm("map_Kd",material->_map_Kd);
    store_parm("map_Ks",material->_map_Ks);
    store_parm("map_Ns",material->_map_Ns);
    store_parm("map_Displ",material->_map_Displ);
    close("parameters");
    close("material");
  }